

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleNamespaceEnumerator.cpp
# Opt level: O0

void __thiscall Js::ModuleNamespaceEnumerator::Reset(ModuleNamespaceEnumerator *this)

{
  EnumeratorFlags e;
  bool bVar1;
  ModuleNamespaceEnumerator *this_local;
  
  this->currentLocalMapIndex = -1;
  this->currentNonLocalMapIndex = -1;
  this->doneWithExports = false;
  e = Js::operator&(this->flags,EnumSymbols);
  bVar1 = operator!(e);
  if (bVar1) {
    this->doneWithSymbol = true;
  }
  else {
    this->doneWithSymbol = false;
  }
  JavascriptStaticEnumerator::Reset(&this->symbolEnumerator);
  return;
}

Assistant:

void ModuleNamespaceEnumerator::Reset()
    {
        currentLocalMapIndex = Constants::NoBigSlot;
        currentNonLocalMapIndex = Constants::NoBigSlot;
        doneWithExports = false;
        if (!!(flags & EnumeratorFlags::EnumSymbols))
        {
            doneWithSymbol = false;
        }
        else
        {
            doneWithSymbol = true;
        }
        symbolEnumerator.Reset();
    }